

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ListBox(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter
                   ,void *data,int items_count,int height_in_items)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  undefined8 in_RCX;
  code *in_RDX;
  int *in_RSI;
  char *item_text;
  ImVec2 *in_stack_00000028;
  bool item_selected;
  int i;
  bool in_stack_00000037;
  char *in_stack_00000038;
  ImGuiListClipper clipper;
  bool value_changed;
  ImGuiContext *g;
  float in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  ImGuiID id;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  ImGuiListClipper *in_stack_ffffffffffffff88;
  int local_68;
  int local_54;
  int local_50;
  
  bVar2 = ListBoxHeader((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  if (bVar2) {
    bVar2 = false;
    GetTextLineHeightWithSpacing();
    ImGuiListClipper::ImGuiListClipper
              ((ImGuiListClipper *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
               in_stack_ffffffffffffff68);
    while( true ) {
      bVar3 = ImGuiListClipper::Step(in_stack_ffffffffffffff88);
      id = (ImGuiID)((ulong)in_stack_ffffffffffffff70 >> 0x20);
      if (!bVar3) break;
      for (local_68 = local_54; local_68 < local_50; local_68 = local_68 + 1) {
        iVar1 = *in_RSI;
        bVar4 = (*in_RDX)(in_RCX,local_68,&stack0xffffffffffffff88);
        in_stack_ffffffffffffff70 = (char *)in_stack_ffffffffffffff88;
        if ((bVar4 & 1) == 0) {
          in_stack_ffffffffffffff70 = "*Unknown item*";
        }
        PushID((int)in_stack_ffffffffffffff84);
        in_stack_ffffffffffffff88 = (ImGuiListClipper *)in_stack_ffffffffffffff70;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,0.0,0.0);
        bVar3 = Selectable(in_stack_00000038,in_stack_00000037,i,in_stack_00000028);
        if (bVar3) {
          *in_RSI = local_68;
          bVar2 = true;
        }
        if (local_68 == iVar1) {
          SetItemDefaultFocus();
        }
        PopID();
      }
    }
    ListBoxFooter();
    if (bVar2) {
      MarkItemEdited(id);
    }
    ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)0x218b53);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::ListBox(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int height_in_items)
{
    if (!ListBoxHeader(label, items_count, height_in_items))
        return false;

    // Assume all items have even height (= 1 line of text). If you need items of different or variable sizes you can create a custom version of ListBox() in your code without using the clipper.
    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    ImGuiListClipper clipper(items_count, GetTextLineHeightWithSpacing()); // We know exactly our line height here so we pass it as a minor optimization, but generally you don't need to.
    while (clipper.Step())
        for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++)
        {
            const bool item_selected = (i == *current_item);
            const char* item_text;
            if (!items_getter(data, i, &item_text))
                item_text = "*Unknown item*";

            PushID(i);
            if (Selectable(item_text, item_selected))
            {
                *current_item = i;
                value_changed = true;
            }
            if (item_selected)
                SetItemDefaultFocus();
            PopID();
        }
    ListBoxFooter();
    if (value_changed)
        MarkItemEdited(g.CurrentWindow->DC.LastItemId);

    return value_changed;
}